

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyncExecutor.h
# Opt level: O0

void __thiscall
nrg::SyncExecutor::operator()
          (SyncExecutor *this,
          _func_void_basic_ostream<char,_std::char_traits<char>_>_ptr_int_ptr *fn,
          reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *param,int *param_3)

{
  function<void_()> local_80;
  undefined1 local_60 [24];
  undefined1 local_48 [8];
  Function f;
  int *param_local_1;
  reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *param_local;
  _func_void_basic_ostream<char,_std::char_traits<char>_>_ptr_int_ptr *fn_local;
  SyncExecutor *this_local;
  
  local_60._0_8_ = &param_local;
  local_60._8_8_ = param;
  local_60._16_8_ = param_3;
  f._M_invoker = (_Invoker_type)param_3;
  param_local = (reference_wrapper<std::basic_ostream<char,_std::char_traits<char>_>_> *)fn;
  fn_local = (_func_void_basic_ostream<char,_std::char_traits<char>_>_ptr_int_ptr *)this;
  std::function<void()>::operator()
            ((function<void()> *)local_48,(anon_class_24_3_7e084ec6 *)local_60);
  std::function<void_()>::function(&local_80,(function<void_()> *)local_48);
  operator()(this,&local_80);
  std::function<void_()>::~function(&local_80);
  std::function<void_()>::~function((function<void_()> *)local_48);
  return;
}

Assistant:

void operator()(FN fn, Param&&... param)
    {
        Function f([&]() { fn(std::forward<Param>(param)...); });
        (*this)(std::move(f));
    }